

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEDPublicKey.cpp
# Opt level: O0

void __thiscall OSSLEDPublicKey::setFromOSSL(OSSLEDPublicKey *this,EVP_PKEY *inPKEY)

{
  int iVar1;
  undefined4 uVar2;
  int iVar3;
  ByteString *byteString;
  uchar *puVar4;
  uchar *puVar5;
  EVP_PKEY *in_RSI;
  long *in_RDI;
  ByteString raw;
  uchar *p;
  ByteString der;
  int len;
  EVP_PKEY *key;
  ByteString inEC;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  EDPublicKey *in_stack_fffffffffffffed0;
  undefined1 local_d8 [36];
  int in_stack_ffffffffffffff4c;
  
  uVar2 = EVP_PKEY_get_id(in_RSI);
  *(undefined4 *)(in_RDI + 0xb) = uVar2;
  if ((int)in_RDI[0xb] == 0) {
    return;
  }
  OSSL::oid2ByteString(in_stack_ffffffffffffff4c);
  EDPublicKey::setEC(in_stack_fffffffffffffed0,
                     (ByteString *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  iVar3 = i2d_PUBKEY(in_RSI,(uchar **)0x0);
  if (iVar3 < 1) {
    softHSMLog(3,"setFromOSSL",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDPublicKey.cpp"
               ,0x77,"Could not encode EDDSA public key");
    goto LAB_001b87e4;
  }
  ByteString::ByteString((ByteString *)0x1b847b);
  ByteString::resize((ByteString *)in_stack_fffffffffffffed0,
                     CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  byteString = (ByteString *)
               ByteString::operator[]
                         ((ByteString *)in_stack_fffffffffffffed0,
                          CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  i2d_PUBKEY(in_RSI,(uchar **)&stack0xffffffffffffff78);
  ByteString::ByteString((ByteString *)0x1b84dd);
  iVar1 = (int)in_RDI[0xb];
  if (iVar1 == 0x40a) {
LAB_001b853f:
    if (iVar3 == 0x2c) {
      ByteString::resize((ByteString *)in_stack_fffffffffffffed0,
                         CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      puVar4 = ByteString::operator[]
                         ((ByteString *)in_stack_fffffffffffffed0,
                          CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      puVar5 = ByteString::operator[]
                         ((ByteString *)in_stack_fffffffffffffed0,
                          CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      *(undefined8 *)puVar4 = *(undefined8 *)puVar5;
      *(undefined8 *)(puVar4 + 8) = *(undefined8 *)(puVar5 + 8);
      *(undefined8 *)(puVar4 + 0x10) = *(undefined8 *)(puVar5 + 0x10);
      *(undefined8 *)(puVar4 + 0x18) = *(undefined8 *)(puVar5 + 0x18);
LAB_001b878c:
      DERUTIL::raw2Octet(byteString);
      (**(code **)(*in_RDI + 0x40))(in_RDI,local_d8);
      ByteString::~ByteString((ByteString *)0x1b87bf);
    }
    else {
      softHSMLog(3,"setFromOSSL",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDPublicKey.cpp"
                 ,0x84,"Invalid size. Expected: %lu, Actual: %lu",0x2c,iVar3);
    }
  }
  else if (iVar1 == 0x40b) {
    if (iVar3 == 0x44) {
      ByteString::resize((ByteString *)in_stack_fffffffffffffed0,
                         CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      puVar4 = ByteString::operator[]
                         ((ByteString *)in_stack_fffffffffffffed0,
                          CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      puVar5 = ByteString::operator[]
                         ((ByteString *)in_stack_fffffffffffffed0,
                          CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      memcpy(puVar4,puVar5,0x38);
      goto LAB_001b878c;
    }
    softHSMLog(3,"setFromOSSL",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDPublicKey.cpp"
               ,0x8d,"Invalid size. Expected: %lu, Actual: %lu",0x44,iVar3);
  }
  else {
    if (iVar1 == 0x43f) goto LAB_001b853f;
    if (iVar1 == 0x440) {
      if (iVar3 == 0x45) {
        ByteString::resize((ByteString *)in_stack_fffffffffffffed0,
                           CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        puVar4 = ByteString::operator[]
                           ((ByteString *)in_stack_fffffffffffffed0,
                            CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        puVar5 = ByteString::operator[]
                           ((ByteString *)in_stack_fffffffffffffed0,
                            CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        memcpy(puVar4,puVar5,0x39);
        goto LAB_001b878c;
      }
      softHSMLog(3,"setFromOSSL",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDPublicKey.cpp"
                 ,0x97,"Invalid size. Expected: %lu, Actual: %lu",0x45,iVar3);
    }
  }
  ByteString::~ByteString((ByteString *)0x1b87d7);
  ByteString::~ByteString((ByteString *)0x1b87e4);
LAB_001b87e4:
  ByteString::~ByteString((ByteString *)0x1b87f1);
  return;
}

Assistant:

void OSSLEDPublicKey::setFromOSSL(const EVP_PKEY* inPKEY)
{
	nid = EVP_PKEY_id(inPKEY);
	if (nid == NID_undef)
	{
		return;
	}
	ByteString inEC = OSSL::oid2ByteString(nid);
	EDPublicKey::setEC(inEC);

	// i2d_PUBKEY incorrectly does not const the key argument?!
        EVP_PKEY* key = const_cast<EVP_PKEY*>(inPKEY);
	int len = i2d_PUBKEY(key, NULL);
	if (len <= 0)
	{
		ERROR_MSG("Could not encode EDDSA public key");
		return;
	}
	ByteString der;
	der.resize(len);
	unsigned char *p = &der[0];
	i2d_PUBKEY(key, &p);
	ByteString raw;
	switch (nid) {
	case NID_X25519:
	case NID_ED25519:
		if (len != (X25519_KEYLEN + PREFIXLEN))
		{
			ERROR_MSG("Invalid size. Expected: %lu, Actual: %lu", X25519_KEYLEN + PREFIXLEN, len);
			return;
		}
		raw.resize(X25519_KEYLEN);
		memcpy(&raw[0], &der[PREFIXLEN], X25519_KEYLEN);
		break;
	case NID_X448:
		if (len != (X448_KEYLEN + PREFIXLEN))
		{
			ERROR_MSG("Invalid size. Expected: %lu, Actual: %lu", X448_KEYLEN + PREFIXLEN, len);
			return;
		}
		raw.resize(X448_KEYLEN);
		memcpy(&raw[0], &der[PREFIXLEN], X448_KEYLEN);
		break;
	case NID_ED448:
		if (len != (ED448_KEYLEN + PREFIXLEN))
		{
			ERROR_MSG("Invalid size. Expected: %lu, Actual: %lu",
				  ED448_KEYLEN + PREFIXLEN, len);
			return;
		}
		raw.resize(ED448_KEYLEN);
		memcpy(&raw[0], &der[PREFIXLEN], ED448_KEYLEN);
		break;
	default:
		return;
	}
	setA(DERUTIL::raw2Octet(raw));
}